

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall display::add_monitor(display *this,int mon,int x,int y,int w,int h,Window root)

{
  int *piVar1;
  int local_60;
  int local_5c;
  monitor_t local_58;
  border_t local_35;
  int local_34;
  border_t local_2d;
  int local_2c;
  border_t local_26 [2];
  int local_24;
  int local_20;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  int mon_local;
  display *this_local;
  
  local_26[1] = 2;
  local_24 = h;
  local_20 = w;
  h_local = y;
  w_local = x;
  y_local = mon;
  _x_local = this;
  std::vector<rect,std::allocator<rect>>::
  emplace_back<int&,int&,int_const&,int&,int&,border_t,unsigned_long&>
            ((vector<rect,std::allocator<rect>> *)&this->border_rects,&w_local,&h_local,
             &BORDER_WIDTH,&local_24,&y_local,local_26 + 1,&root);
  local_26[0] = TOP;
  std::vector<rect,std::allocator<rect>>::
  emplace_back<int&,int&,int&,int_const&,int&,border_t,unsigned_long&>
            ((vector<rect,std::allocator<rect>> *)&this->border_rects,&w_local,&h_local,&local_20,
             &BORDER_WIDTH,&y_local,local_26,&root);
  local_2c = w_local + local_20 + -1;
  local_2d = RIGHT;
  std::vector<rect,std::allocator<rect>>::
  emplace_back<int,int&,int_const&,int&,int&,border_t,unsigned_long&>
            ((vector<rect,std::allocator<rect>> *)&this->border_rects,&local_2c,&h_local,
             &BORDER_WIDTH,&local_24,&y_local,&local_2d,&root);
  local_34 = h_local + local_24 + -1;
  local_35 = BOTTOM;
  std::vector<rect,std::allocator<rect>>::
  emplace_back<int&,int,int&,int_const&,int&,border_t,unsigned_long&>
            ((vector<rect,std::allocator<rect>> *)&this->border_rects,&w_local,&local_34,&local_20,
             &BORDER_WIDTH,&y_local,&local_35,&root);
  local_58.id = y_local;
  local_58.x = w_local;
  local_58.y = h_local;
  local_58.w = local_20;
  local_58.h = local_24;
  local_58.root = root;
  std::vector<display::monitor_t,_std::allocator<display::monitor_t>_>::
  emplace_back<display::monitor_t>(&this->monitors,&local_58);
  local_5c = w_local + local_20;
  piVar1 = std::max<int>(&local_5c,&this->width);
  this->width = *piVar1;
  local_60 = h_local + local_24;
  piVar1 = std::max<int>(&local_60,&this->height);
  this->height = *piVar1;
  return;
}

Assistant:

void display::add_monitor(int mon, int x, int y, int w, int h, Window root) {
    border_rects.emplace_back(x, y, BORDER_WIDTH, h, mon, border_t::LEFT, root);
    border_rects.emplace_back(x, y, w, BORDER_WIDTH, mon, border_t::TOP, root);
    border_rects.emplace_back(x + w - BORDER_WIDTH, y, BORDER_WIDTH, h, mon, border_t::RIGHT, root);
    border_rects.emplace_back(x, y + h - BORDER_WIDTH, w, BORDER_WIDTH, mon, border_t::BOTTOM, root);

    monitors.emplace_back(monitor_t { .id = mon, .x = x, .y = y, .w = w, .h = h, .root = root });
    width = std::max(x + w, width);
    height = std::max(y + h, height);
}